

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O1

bool __thiscall
embree::SubdivPatch1Base::updateEdgeLevels
          (SubdivPatch1Base *this,float *edge_level,int *subdiv,SubdivMesh *mesh,int simd_width)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined7 uVar11;
  ulong uVar10;
  uint uVar12;
  uint uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float new_level [4];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  computeEdgeLevels(edge_level,subdiv,&local_28);
  fVar5 = this->level[0];
  fVar6 = this->level[1];
  fVar7 = this->level[2];
  fVar8 = this->level[3];
  this->level[0] = local_28;
  this->level[1] = fStack_24;
  this->level[2] = fStack_20;
  this->level[3] = fStack_1c;
  fVar1 = this->level[0];
  fVar2 = this->level[1];
  fVar16 = this->level[2];
  if (this->level[2] <= fVar1) {
    fVar16 = fVar1;
  }
  fVar17 = this->level[3];
  if (this->level[3] <= fVar2) {
    fVar17 = fVar2;
  }
  uVar12 = (int)fVar17 + 1;
  this->grid_u_res = (unsigned_short)((int)fVar16 + 1U);
  this->grid_v_res = (unsigned_short)uVar12;
  uVar13 = (int)fVar16 + 1U & 0xffff;
  uVar10 = (long)(int)(-simd_width & (simd_width + (uVar12 & 0xffff) * uVar13) - 1) /
           (long)simd_width & 0xffffffff;
  this->grid_size_simd_blocks = (unsigned_short)uVar10;
  bVar3 = this->flags;
  uVar11 = (undefined7)(uVar10 >> 8);
  uVar9 = (undefined4)CONCAT71(uVar11,bVar3);
  this->flags = bVar3 & 0xef;
  if (((int)uVar13 <= (int)fVar1 + 1) && ((int)uVar13 <= (int)this->level[2] + 1)) {
    iVar14 = (int)this->level[3] + 1;
    uVar12 = uVar12 & 0xffff;
    auVar15._0_4_ = -(uint)(iVar14 < (int)uVar12);
    auVar15._4_4_ = -(uint)(iVar14 < (int)uVar12);
    auVar15._8_4_ = -(uint)((int)fVar2 + 1 < (int)uVar12);
    auVar15._12_4_ = -(uint)((int)fVar2 + 1 < (int)uVar12);
    iVar14 = movmskpd(uVar12,auVar15);
    if (iVar14 == 0) goto LAB_00e3b972;
  }
  uVar10 = CONCAT71(uVar11,bVar3) | 0x10;
  uVar9 = (undefined4)uVar10;
  this->flags = (uchar)uVar10;
LAB_00e3b972:
  auVar4._4_4_ = -(uint)((int)fVar6 == (int)fStack_24);
  auVar4._0_4_ = -(uint)((int)fVar5 == (int)local_28);
  auVar4._8_4_ = -(uint)((int)fVar7 == (int)fStack_20);
  auVar4._12_4_ = -(uint)((int)fVar8 == (int)fStack_1c);
  iVar14 = movmskps(uVar9,auVar4);
  return iVar14 != 0xf;
}

Assistant:

bool SubdivPatch1Base::updateEdgeLevels(const float edge_level[4], const int subdiv[4], const SubdivMesh *const mesh, const int simd_width)
  {
    /* calculate edge levels */
    float new_level[4];
    computeEdgeLevels(edge_level,subdiv,new_level);

    /* calculate if tessellation pattern changed */
    bool grid_changed = false;
    for (size_t i=0; i<4; i++) {
      grid_changed |= (int)new_level[i] != (int)level[i]; 
      level[i] = new_level[i];
    }

    /* compute grid resolution */
    Vec2i res = computeGridSize(level);
    grid_u_res = res.x; grid_v_res = res.y;
    grid_size_simd_blocks = ((grid_u_res*grid_v_res+simd_width-1)&(-simd_width)) / simd_width;

    /* need stiching? */
    flags &= ~TRANSITION_PATCH;
    const int int_edge_points0 = (int)level[0] + 1;
    const int int_edge_points1 = (int)level[1] + 1;
    const int int_edge_points2 = (int)level[2] + 1;
    const int int_edge_points3 = (int)level[3] + 1;
    if (int_edge_points0 < (int)grid_u_res ||
	int_edge_points2 < (int)grid_u_res ||
	int_edge_points1 < (int)grid_v_res ||
	int_edge_points3 < (int)grid_v_res) {
      flags |= TRANSITION_PATCH;
    }

    return grid_changed;
  }